

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.cpp
# Opt level: O2

void dlib::http_impl::parse_url(string *word,key_value_map *queries)

{
  pointer pcVar1;
  ulong uVar2;
  long lVar3;
  mapped_type *pmVar4;
  string value;
  string local_1f0;
  string key;
  istringstream sin;
  byte abStack_190 [352];
  
  for (uVar2 = 0; uVar2 < word->_M_string_length; uVar2 = uVar2 + 1) {
    pcVar1 = (word->_M_dataplus)._M_p;
    if (pcVar1[uVar2] == '&') {
      pcVar1[uVar2] = ' ';
    }
  }
  std::__cxx11::istringstream::istringstream((istringstream *)&sin,(string *)word,_S_in);
  std::operator>>((istream *)&sin,(string *)word);
  while ((abStack_190[(long)_sin[-3]] & 5) == 0) {
    lVar3 = std::__cxx11::string::find_first_of((char *)word,0x2de1fb);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&value,(ulong)word);
      urldecode(&key,&value);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::substr((ulong)&local_1f0,(ulong)word);
      urldecode(&value,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&queries->
                             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ,&key);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&key);
    }
    std::operator>>((istream *)&sin,(string *)word);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&sin);
  return;
}

Assistant:

void parse_url(
            std::string word, 
            key_value_map& queries
        )
        /*!
            Parses the query string of a URL.  word should be the stuff that comes
            after the ? in the query URL.
        !*/
        {
            std::string::size_type pos;

            for (pos = 0; pos < word.size(); ++pos)
            {
                if (word[pos] == '&')
                    word[pos] = ' ';
            }

            std::istringstream sin(word);
            sin >> word;
            while (sin)
            {
                pos = word.find_first_of("=");
                if (pos != std::string::npos)
                {
                    std::string key = urldecode(word.substr(0,pos));
                    std::string value = urldecode(word.substr(pos+1));

                    queries[key] = value;
                }
                sin >> word;
            }
        }